

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O1

void __thiscall
MarkdownHighlighter::highlightAdditionalRules
          (MarkdownHighlighter *this,QVector<HighlightingRule> *rules,QString *text)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  pair<int,_int> *ppVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  QRegularExpressionMatchIterator iterator;
  QTextCharFormat currentMaskedFormat;
  QRegularExpressionMatch match;
  HighlightingRule *local_a8;
  QRegularExpressionMatchIterator local_a0 [8];
  QTextCharFormat *local_98;
  QString *local_90;
  HighlighterState *local_88;
  QTextFormat local_80 [16];
  QPodArrayOps<std::pair<int,int>> *local_70;
  HighlightingRule *local_68;
  QTextFormat *local_60;
  QRegularExpressionMatch local_58 [8];
  anon_union_24_3_e3d07ef4_for_data local_50;
  
  local_50._0_4_ = 0x18;
  local_90 = text;
  local_60 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                        (&_formats,(HighlighterState *)local_50.data)->super_QTextFormat;
  local_70 = (QPodArrayOps<std::pair<int,int>> *)&this->_linkRanges;
  QList<std::pair<int,_int>_>::clear((QList<std::pair<int,_int>_> *)local_70);
  lVar11 = (rules->d).size;
  if (lVar11 != 0) {
    local_a8 = (rules->d).ptr;
    local_68 = local_a8 + lVar11;
    do {
      iVar6 = QSyntaxHighlighter::currentBlockState();
      if (iVar6 == -1) {
        lVar11 = QString::indexOf(local_90,(longlong)&local_a8->shouldContain,CaseInsensitive);
        if (lVar11 != -1) {
          QRegularExpression::globalMatch(local_a0,local_a8,local_90,0,0,0);
          bVar3 = local_a8->capturingGroup;
          local_88 = &local_a8->state;
          local_98 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                               (&_formats,local_88);
          while( true ) {
            cVar5 = QRegularExpressionMatchIterator::hasNext();
            if (cVar5 == '\0') break;
            QRegularExpressionMatchIterator::next();
            iVar6 = (int)local_58;
            if (bVar3 != 0) {
              QTextFormat::QTextFormat(local_80,local_60);
              dVar13 = (double)QTextFormat::doubleProperty((int)local_98);
              if (0.0 < dVar13) {
                dVar13 = (double)QTextFormat::doubleProperty((int)local_98);
                QVariant::QVariant((QVariant *)&local_50,dVar13);
                QTextFormat::setProperty((int)local_80,(QVariant *)0x2001);
                QVariant::~QVariant((QVariant *)&local_50);
              }
              iVar7 = QSyntaxHighlighter::currentBlockState();
              if (iVar7 < 0xc) {
LAB_0012229b:
                if (*local_88 == Link) {
                  iVar7 = QRegularExpressionMatch::capturedStart(iVar6);
                  iVar8 = QRegularExpressionMatch::capturedStart(iVar6);
                  iVar9 = QRegularExpressionMatch::capturedLength(iVar6);
                  lVar11 = (this->_linkRanges).d.size;
                  if (lVar11 < 1) {
LAB_0012231b:
                    lVar12 = -1;
                  }
                  else {
                    ppVar4 = (this->_linkRanges).d.ptr;
                    lVar1 = -8;
                    do {
                      lVar12 = lVar1;
                      lVar2 = lVar11 * -8 + lVar12;
                      if (lVar2 == -8) goto LAB_00122315;
                      lVar1 = lVar12 + 8;
                    } while ((*(int *)((long)&ppVar4[1].first + lVar12) != iVar7) ||
                            (*(int *)((long)&ppVar4[1].second + lVar12) != iVar9 + iVar8));
                    lVar12 = lVar1 >> 3;
LAB_00122315:
                    if (lVar2 == -8) goto LAB_0012231b;
                  }
                  if (lVar12 == -1) {
                    local_50._0_4_ = iVar7;
                    local_50._4_4_ = iVar9 + iVar8;
                    QtPrivate::QPodArrayOps<std::pair<int,int>>::emplace<std::pair<int,int>>
                              (local_70,lVar11,(pair<int,_int> *)&local_50.shared);
                  }
                }
                iVar7 = QRegularExpressionMatch::capturedStart(iVar6);
                uVar10 = QRegularExpressionMatch::capturedLength(iVar6);
                QSyntaxHighlighter::setFormat((int)this,iVar7,(QTextCharFormat *)(ulong)uVar10);
              }
              else {
                iVar7 = QSyntaxHighlighter::currentBlockState();
                if (0x11 < iVar7) goto LAB_0012229b;
              }
              QTextFormat::~QTextFormat(local_80);
            }
            iVar7 = QSyntaxHighlighter::currentBlockState();
            if (iVar7 < 0xc) {
LAB_001223aa:
              iVar7 = QRegularExpressionMatch::capturedStart(iVar6);
              uVar10 = QRegularExpressionMatch::capturedLength(iVar6);
              QSyntaxHighlighter::setFormat((int)this,iVar7,(QTextCharFormat *)(ulong)uVar10);
            }
            else {
              iVar7 = QSyntaxHighlighter::currentBlockState();
              if (0x11 < iVar7) goto LAB_001223aa;
              setHeadingStyles(this,*local_88,local_58,(uint)bVar3);
            }
            QRegularExpressionMatch::~QRegularExpressionMatch(local_58);
          }
          QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(local_a0);
        }
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_68);
  }
  return;
}

Assistant:

void MarkdownHighlighter::highlightAdditionalRules(
    const QVector<HighlightingRule> &rules, const QString &text) {
    const auto &maskedFormat = _formats[HighlighterState::MaskedSyntax];
    _linkRanges.clear();

    for (const HighlightingRule &rule : rules) {
        // continue if another current block state was already set if
        // disableIfCurrentStateIsSet is set
        if (currentBlockState() != NoState) continue;

        const bool contains = text.contains(rule.shouldContain);
        if (!contains) continue;

        auto iterator = rule.pattern.globalMatch(text);
        const uint8_t capturingGroup = rule.capturingGroup;
        const uint8_t maskedGroup = rule.maskedGroup;
        const QTextCharFormat &format = _formats[rule.state];

        // find and format all occurrences
        while (iterator.hasNext()) {
            QRegularExpressionMatch match = iterator.next();

            // if there is a capturingGroup set then first highlight
            // everything as MaskedSyntax and highlight capturingGroup
            // with the real format
            if (capturingGroup > 0) {
                QTextCharFormat currentMaskedFormat = maskedFormat;
                // set the font size from the current rule's font format
                if (format.fontPointSize() > 0) {
                    currentMaskedFormat.setFontPointSize(
                        format.fontPointSize());
                }

                if (currentBlockState() >= H1 && currentBlockState() <= H6) {
                    // setHeadingStyles(format, match, maskedGroup);

                } else {
                    // store masked part of the link as a range
                    if (rule.state == Link) {
                        const int start = match.capturedStart(maskedGroup);
                        const int end = match.capturedStart(maskedGroup) +
                                        match.capturedLength(maskedGroup);
                        if (!_linkRanges.contains({start, end})) {
                            _linkRanges.append({start, end});
                        }
                    }

                    setFormat(match.capturedStart(maskedGroup),
                              match.capturedLength(maskedGroup),
                              currentMaskedFormat);
                }
            }
            if (currentBlockState() >= H1 && currentBlockState() <= H6) {
                setHeadingStyles(rule.state, match, capturingGroup);

            } else {
                setFormat(match.capturedStart(capturingGroup),
                          match.capturedLength(capturingGroup), format);
            }
        }
    }
}